

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

double __thiscall
duckdb::Interpolator<false>::Interpolate<unsigned_long,double,duckdb::QuantileIndirect<double>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<double> *accessor)

{
  DataChunk *pDVar1;
  CURSOR *pCVar2;
  double dVar3;
  bool bVar4;
  reference pvVar5;
  ulong uVar6;
  InvalidInputException *pIVar7;
  duckdb *pdVar8;
  double dVar9;
  double result_1;
  double local_60;
  string local_58;
  double local_38;
  
  pCVar2 = accessor->data;
  uVar6 = (pCVar2->scan).current_row_index;
  bVar4 = (pCVar2->scan).next_row_index <= lidx;
  if (lidx == hidx) {
    if (lidx < uVar6 || bVar4) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,lidx,&pCVar2->scan,pDVar1);
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (double *)pvVar5->data;
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar5);
      pCVar2->validity = &pvVar5->validity;
      uVar6 = (pCVar2->scan).current_row_index;
    }
    dVar9 = pCVar2->data[(uint)((int)lidx - (int)uVar6)];
    pdVar8 = (duckdb *)0x0;
    bVar4 = TryCast::Operation<double,double>(dVar9,&local_60,false);
    if (!bVar4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_58,pdVar8,dVar9);
      InvalidInputException::InvalidInputException(pIVar7,&local_58);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (lidx < uVar6 || bVar4) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,lidx,&pCVar2->scan,pDVar1);
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (double *)pvVar5->data;
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar5);
      pCVar2->validity = &pvVar5->validity;
      uVar6 = (pCVar2->scan).current_row_index;
    }
    dVar9 = pCVar2->data[(uint)((int)lidx - (int)uVar6)];
    pdVar8 = (duckdb *)0x0;
    bVar4 = TryCast::Operation<double,double>(dVar9,&local_60,false);
    dVar3 = local_60;
    if (!bVar4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_58,pdVar8,dVar9);
      InvalidInputException::InvalidInputException(pIVar7,&local_58);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar2 = accessor->data;
    uVar6 = (pCVar2->scan).current_row_index;
    if ((pCVar2->scan).next_row_index <= hidx || hidx < uVar6) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,hidx,&pCVar2->scan,pDVar1);
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (double *)pvVar5->data;
      pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar5);
      pCVar2->validity = &pvVar5->validity;
      uVar6 = (pCVar2->scan).current_row_index;
    }
    local_38 = pCVar2->data[(uint)((int)hidx - (int)uVar6)];
    pdVar8 = (duckdb *)0x0;
    bVar4 = TryCast::Operation<double,double>(local_38,&local_60,false);
    if (!bVar4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_58,pdVar8,local_38);
      InvalidInputException::InvalidInputException(pIVar7,&local_58);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    dVar9 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_60 = dVar9 * local_60 + dVar3 * (1.0 - dVar9);
  }
  return local_60;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}